

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall
Diligent::GLContextState::SetBlendState
          (GLContextState *this,BlendStateDesc *BSDsc,Uint32 RenderTargetMask,Uint32 SampleMask)

{
  bool bVar1;
  undefined *puVar2;
  GLenum GVar3;
  GLenum GVar4;
  GLenum GVar5;
  GLenum GVar6;
  undefined8 uVar7;
  Char *pCVar8;
  GLContextState *pGVar9;
  char (*in_R8) [63];
  GLint *in_stack_fffffffffffffc58;
  char (*in_stack_fffffffffffffc68) [14];
  undefined1 local_308 [8];
  string msg_13;
  undefined1 local_2e0 [4];
  GLenum err_9;
  string msg_12;
  GLenum err_8;
  GLenum modeAlpha_1;
  GLenum modeRGB_1;
  string msg_11;
  GLenum err_7;
  GLenum dstFactorAlpha_1;
  GLenum srcFactorAlpha_1;
  GLenum dstFactorRGB_1;
  GLenum srcFactorRGB_1;
  RenderTargetBlendDesc *RT0;
  string msg_10;
  undefined1 local_248 [4];
  GLenum err_6;
  string msg_9;
  GLenum err_5;
  GLenum modeAlpha;
  GLenum modeRGB;
  string msg_8;
  GLenum err_4;
  GLenum dstFactorAlpha;
  GLenum srcFactorAlpha;
  GLenum dstFactorRGB;
  GLenum srcFactorRGB;
  string msg_7;
  undefined1 local_1b8 [4];
  GLenum err_3;
  string _msg_2;
  RenderTargetBlendDesc *RT_1;
  undefined1 local_188 [4];
  int i;
  string msg_6;
  undefined1 local_160 [4];
  GLenum err_2;
  string msg_5;
  undefined1 local_138 [4];
  GLenum err_1;
  string msg_4;
  undefined1 local_110 [4];
  GLenum err;
  string msg_3;
  Uint32 rt_1;
  Uint32 Mask_1;
  string msg_2;
  RenderTargetBlendDesc *RT;
  string msg_1;
  Uint32 local_98;
  Uint32 rt;
  Uint32 Mask;
  string _msg_1;
  string msg;
  COLOR_MASK NonIndexedColorMask;
  bool bUseIndexedColorWriteMasks;
  bool bEnableBlend;
  undefined1 local_40 [8];
  string _msg;
  Uint32 SampleMask_local;
  Uint32 RenderTargetMask_local;
  BlendStateDesc *BSDsc_local;
  GLContextState *this_local;
  
  _msg.field_2._8_4_ = SampleMask;
  _msg.field_2._12_4_ = RenderTargetMask;
  if (SampleMask != 0xffffffff) {
    FormatString<char[55]>
              ((string *)local_40,
               (char (*) [55])"Sample mask is not currently implemented in GL backend");
    puVar2 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar7 = std::__cxx11::string::c_str();
      in_R8 = (char (*) [63])0x0;
      (*(code *)puVar2)(2,uVar7,0);
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  msg.field_2._M_local_buf[0xb] = BSDsc->RenderTargets[0].BlendEnable & 1;
  bVar1 = false;
  msg.field_2._M_local_buf[9] = '\0';
  if ((_msg.field_2._12_4_ & 0xffffff00) != 0) {
    FormatString<char[21],unsigned_int,char[63]>
              ((string *)((long)&_msg_1.field_2 + 8),(Diligent *)"Render target mask (",
               (char (*) [21])((long)&_msg.field_2 + 0xc),
               (uint *)") contains bits that correspond to non-existent render targets",in_R8);
    pCVar8 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar8,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x2db);
    std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
    _msg.field_2._12_4_ = _msg.field_2._12_4_ & 0xff;
  }
  if ((_msg.field_2._12_4_ & ((1 << ((byte)(this->m_Caps).MaxDrawBuffers & 0x1f)) - 1U ^ 0xffffffff)
      ) != 0) {
    rt = LinuxMisc::GetLSB(_msg.field_2._12_4_);
    in_stack_fffffffffffffc58 = &(this->m_Caps).MaxDrawBuffers;
    FormatString<char[21],unsigned_int,char[19],unsigned_int,char[32],int,char[14]>
              ((string *)&Mask,(Diligent *)"Render target mask (",
               (char (*) [21])((long)&_msg.field_2 + 0xc),(uint *)") contains buffer ",
               (char (*) [19])&rt,(uint *)" but this device only supports ",
               (char (*) [32])in_stack_fffffffffffffc58,(int *)" draw buffers",
               in_stack_fffffffffffffc68);
    puVar2 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar7 = std::__cxx11::string::c_str();
      (*(code *)puVar2)(2,uVar7,0);
    }
    std::__cxx11::string::~string((string *)&Mask);
    _msg.field_2._12_4_ =
         (1 << ((byte)(this->m_Caps).MaxDrawBuffers & 0x1f)) - 1U & _msg.field_2._12_4_;
  }
  local_98 = _msg.field_2._12_4_;
  while (local_98 != 0) {
    msg_1.field_2._12_4_ = LinuxMisc::GetLSB(local_98);
    local_98 = (1 << ((byte)msg_1.field_2._12_4_ & 0x1f) ^ 0xffffffffU) & local_98;
    pGVar9 = (GLContextState *)(ulong)(uint)msg_1.field_2._12_4_;
    if ((7 < (uint)msg_1.field_2._12_4_) ||
       (pGVar9 = this, (this->m_Caps).MaxDrawBuffers <= (int)msg_1.field_2._12_4_)) {
      FormatString<char[26],char[72]>
                ((string *)&RT,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers",
                 (char (*) [72])pGVar9);
      pCVar8 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar8,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x2e9);
      std::__cxx11::string::~string((string *)&RT);
    }
    msg_2.field_2._8_8_ = BSDsc->RenderTargets + (uint)msg_1.field_2._12_4_;
    if (((RenderTargetBlendDesc *)msg_2.field_2._8_8_)->RenderTargetWriteMask == COLOR_MASK_NONE) {
      FormatString<char[103]>
                ((string *)&rt_1,
                 (char (*) [103])
                 "Render target write mask should not be COLOR_MASK_NONE if corresponding bit is set in RenderTargetMask"
                );
      pCVar8 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar8,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x2ec);
      std::__cxx11::string::~string((string *)&rt_1);
    }
    if (msg.field_2._M_local_buf[9] == '\0') {
      msg.field_2._M_local_buf[9] = *(char *)(msg_2.field_2._8_8_ + 9);
    }
    else if (msg.field_2._M_local_buf[9] != *(char *)(msg_2.field_2._8_8_ + 9)) {
      bVar1 = true;
    }
    if (((BSDsc->IndependentBlendEnable & 1U) != 0) && ((*(byte *)msg_2.field_2._8_8_ & 1) != 0)) {
      msg.field_2._M_local_buf[0xb] = '\x01';
    }
  }
  if (bVar1) {
    msg_3.field_2._12_4_ = _msg.field_2._12_4_;
    while (msg_3.field_2._12_4_ != 0) {
      msg_3.field_2._8_4_ = LinuxMisc::GetLSB(msg_3.field_2._12_4_);
      msg_3.field_2._12_4_ =
           (1 << ((byte)msg_3.field_2._8_4_ & 0x1f) ^ 0xffffffffU) & msg_3.field_2._12_4_;
      pGVar9 = (GLContextState *)(ulong)(uint)msg_3.field_2._8_4_;
      if ((7 < (uint)msg_3.field_2._8_4_) ||
         (pGVar9 = this, (this->m_Caps).MaxDrawBuffers <= (int)msg_3.field_2._8_4_)) {
        FormatString<char[26],char[72]>
                  ((string *)local_110,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers",
                   (char (*) [72])pGVar9);
        pCVar8 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar8,"SetBlendState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x300);
        std::__cxx11::string::~string((string *)local_110);
      }
      SetColorWriteMaskIndexed
                (this,msg_3.field_2._8_4_,
                 (uint)BSDsc->RenderTargets[(uint)msg_3.field_2._8_4_].RenderTargetWriteMask);
    }
  }
  else if (msg.field_2._M_local_buf[9] != '\0') {
    SetColorWriteMask(this,(uint)(byte)msg.field_2._M_local_buf[9]);
  }
  if (msg.field_2._M_local_buf[0xb] == '\0') {
    glDisable();
    msg_13.field_2._12_4_ = glGetError();
    if (msg_13.field_2._12_4_ != 0) {
      LogError<false,char[33],char[17],unsigned_int>
                (false,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x354,(char (*) [33])"Failed to disable alpha blending",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_13.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_308,(char (*) [6])0xe8e72e);
      pCVar8 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar8,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x354);
      std::__cxx11::string::~string((string *)local_308);
    }
  }
  else {
    glEnable();
    msg_4.field_2._12_4_ = glGetError();
    if (msg_4.field_2._12_4_ != 0) {
      in_stack_fffffffffffffc58 = (GLint *)(msg_4.field_2._M_local_buf + 0xc);
      LogError<false,char[32],char[17],unsigned_int>
                (false,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x30e,(char (*) [32])"Failed to enable alpha blending",
                 (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_fffffffffffffc58);
      FormatString<char[6]>((string *)local_138,(char (*) [6])0xe8e72e);
      pCVar8 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar8,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x30e);
      std::__cxx11::string::~string((string *)local_138);
    }
    if ((BSDsc->AlphaToCoverageEnable & 1U) == 0) {
      glDisable();
      msg_6.field_2._12_4_ = glGetError();
      if (msg_6.field_2._12_4_ != 0) {
        in_stack_fffffffffffffc58 = (GLint *)(msg_6.field_2._M_local_buf + 0xc);
        LogError<false,char[36],char[17],unsigned_int>
                  (false,"SetBlendState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x318,(char (*) [36])"Failed to disable alpha to coverage",
                   (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_fffffffffffffc58);
        FormatString<char[6]>((string *)local_188,(char (*) [6])0xe8e72e);
        pCVar8 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar8,"SetBlendState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x318);
        std::__cxx11::string::~string((string *)local_188);
      }
    }
    else {
      glEnable();
      msg_5.field_2._12_4_ = glGetError();
      if (msg_5.field_2._12_4_ != 0) {
        in_stack_fffffffffffffc58 = (GLint *)(msg_5.field_2._M_local_buf + 0xc);
        LogError<false,char[35],char[17],unsigned_int>
                  (false,"SetBlendState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x313,(char (*) [35])"Failed to enable alpha to coverage",
                   (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_fffffffffffffc58);
        FormatString<char[6]>((string *)local_160,(char (*) [6])0xe8e72e);
        pCVar8 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar8,"SetBlendState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x313);
        std::__cxx11::string::~string((string *)local_160);
      }
    }
    if ((BSDsc->IndependentBlendEnable & 1U) == 0) {
      GVar3 = BlendFactor2GLBlend(BSDsc->RenderTargets[0].SrcBlend);
      GVar4 = BlendFactor2GLBlend(BSDsc->RenderTargets[0].DestBlend);
      GVar5 = BlendFactor2GLBlend(BSDsc->RenderTargets[0].SrcBlendAlpha);
      GVar6 = BlendFactor2GLBlend(BSDsc->RenderTargets[0].DestBlendAlpha);
      (*__glewBlendFuncSeparate)(GVar3,GVar4,GVar5,GVar6);
      msg_11.field_2._12_4_ = glGetError();
      if (msg_11.field_2._12_4_ != 0) {
        LogError<false,char[31],char[17],unsigned_int>
                  (false,"SetBlendState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x348,(char (*) [31])"Failed to set blending factors",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_11.field_2._M_local_buf + 0xc));
        FormatString<char[6]>((string *)&modeAlpha_1,(char (*) [6])0xe8e72e);
        pCVar8 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar8,"SetBlendState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x348);
        std::__cxx11::string::~string((string *)&modeAlpha_1);
      }
      GVar3 = BlendOperation2GLBlendOp(BSDsc->RenderTargets[0].BlendOp);
      GVar4 = BlendOperation2GLBlendOp(BSDsc->RenderTargets[0].BlendOpAlpha);
      (*__glewBlendEquationSeparate)(GVar3,GVar4);
      msg_12.field_2._12_4_ = glGetError();
      if (msg_12.field_2._12_4_ != 0) {
        LogError<false,char[33],char[17],unsigned_int>
                  (false,"SetBlendState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x34d,(char (*) [33])"Failed to set blending equations",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_12.field_2._M_local_buf + 0xc));
        FormatString<char[6]>((string *)local_2e0,(char (*) [6])0xe8e72e);
        pCVar8 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar8,"SetBlendState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x34d);
        std::__cxx11::string::~string((string *)local_2e0);
      }
    }
    else {
      for (RT_1._4_4_ = 0; (int)RT_1._4_4_ < 8; RT_1._4_4_ = RT_1._4_4_ + 1) {
        _msg_2.field_2._8_8_ = BSDsc->RenderTargets + (int)RT_1._4_4_;
        if ((int)RT_1._4_4_ < (this->m_Caps).MaxDrawBuffers) {
          if ((((RenderTargetBlendDesc *)_msg_2.field_2._8_8_)->BlendEnable & 1U) == 0) {
            (*__glewDisablei)(0xbe2,RT_1._4_4_);
            msg_10.field_2._12_4_ = glGetError();
            if (msg_10.field_2._12_4_ != 0) {
              in_stack_fffffffffffffc58 = (GLint *)(msg_10.field_2._M_local_buf + 0xc);
              LogError<false,char[33],char[17],unsigned_int>
                        (false,"SetBlendState",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                         ,0x33b,(char (*) [33])"Failed to disable alpha blending",
                         (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_fffffffffffffc58);
              FormatString<char[6]>((string *)&RT0,(char (*) [6])0xe8e72e);
              pCVar8 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar8,"SetBlendState",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                         ,0x33b);
              std::__cxx11::string::~string((string *)&RT0);
            }
          }
          else {
            (*__glewEnablei)(0xbe2,RT_1._4_4_);
            msg_7.field_2._12_4_ = glGetError();
            if (msg_7.field_2._12_4_ != 0) {
              in_stack_fffffffffffffc58 = (GLint *)(msg_7.field_2._M_local_buf + 0xc);
              LogError<false,char[32],char[17],unsigned_int>
                        (false,"SetBlendState",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                         ,0x32b,(char (*) [32])"Failed to enable alpha blending",
                         (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_fffffffffffffc58);
              FormatString<char[6]>((string *)&dstFactorRGB,(char (*) [6])0xe8e72e);
              pCVar8 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar8,"SetBlendState",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                         ,0x32b);
              std::__cxx11::string::~string((string *)&dstFactorRGB);
            }
            GVar3 = BlendFactor2GLBlend(*(BLEND_FACTOR *)(_msg_2.field_2._8_8_ + 2));
            GVar4 = BlendFactor2GLBlend(*(BLEND_FACTOR *)(_msg_2.field_2._8_8_ + 3));
            GVar5 = BlendFactor2GLBlend(*(BLEND_FACTOR *)(_msg_2.field_2._8_8_ + 5));
            GVar6 = BlendFactor2GLBlend(*(BLEND_FACTOR *)(_msg_2.field_2._8_8_ + 6));
            (*__glewBlendFuncSeparatei)(RT_1._4_4_,GVar3,GVar4,GVar5,GVar6);
            msg_8.field_2._12_4_ = glGetError();
            if (msg_8.field_2._12_4_ != 0) {
              in_stack_fffffffffffffc58 = (GLint *)(msg_8.field_2._M_local_buf + 0xc);
              LogError<false,char[40],char[17],unsigned_int>
                        (false,"SetBlendState",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                         ,0x332,(char (*) [40])"Failed to set separate blending factors",
                         (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_fffffffffffffc58);
              FormatString<char[6]>((string *)&modeAlpha,(char (*) [6])0xe8e72e);
              pCVar8 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar8,"SetBlendState",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                         ,0x332);
              std::__cxx11::string::~string((string *)&modeAlpha);
            }
            GVar3 = BlendOperation2GLBlendOp(*(BLEND_OPERATION *)(_msg_2.field_2._8_8_ + 4));
            GVar4 = BlendOperation2GLBlendOp(*(BLEND_OPERATION *)(_msg_2.field_2._8_8_ + 7));
            (*__glewBlendEquationSeparatei)(RT_1._4_4_,GVar3,GVar4);
            msg_9.field_2._12_4_ = glGetError();
            if (msg_9.field_2._12_4_ != 0) {
              in_stack_fffffffffffffc58 = (GLint *)(msg_9.field_2._M_local_buf + 0xc);
              LogError<false,char[42],char[17],unsigned_int>
                        (false,"SetBlendState",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                         ,0x336,(char (*) [42])"Failed to set separate blending equations",
                         (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_fffffffffffffc58);
              FormatString<char[6]>((string *)local_248,(char (*) [6])0xe8e72e);
              pCVar8 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar8,"SetBlendState",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                         ,0x336);
              std::__cxx11::string::~string((string *)local_248);
            }
          }
        }
        else if ((((RenderTargetBlendDesc *)_msg_2.field_2._8_8_)->BlendEnable & 1U) != 0) {
          FormatString<char[36],int,char[32],int,char[14]>
                    ((string *)local_1b8,(Diligent *)"Blend is enabled for render target ",
                     (char (*) [36])((long)&RT_1 + 4),(int *)" but this device only supports ",
                     (char (*) [32])&(this->m_Caps).MaxDrawBuffers,(int *)" draw buffers",
                     (char (*) [14])in_stack_fffffffffffffc58);
          puVar2 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar7 = std::__cxx11::string::c_str();
            (*(code *)puVar2)(2,uVar7,0);
          }
          std::__cxx11::string::~string((string *)local_1b8);
        }
      }
    }
  }
  return;
}

Assistant:

void GLContextState::SetBlendState(const BlendStateDesc& BSDsc, Uint32 RenderTargetMask, Uint32 SampleMask)
{
    if (SampleMask != 0xFFFFFFFF)
        LOG_ERROR_MESSAGE("Sample mask is not currently implemented in GL backend");

    bool       bEnableBlend               = BSDsc.RenderTargets[0].BlendEnable;
    bool       bUseIndexedColorWriteMasks = false;
    COLOR_MASK NonIndexedColorMask        = COLOR_MASK_NONE;

    if (RenderTargetMask & ~((1u << MAX_RENDER_TARGETS) - 1u))
    {
        UNEXPECTED("Render target mask (", RenderTargetMask, ") contains bits that correspond to non-existent render targets");
        RenderTargetMask &= (1u << MAX_RENDER_TARGETS) - 1u;
    }

    if (RenderTargetMask & ~((1u << m_Caps.MaxDrawBuffers) - 1u))
    {
        LOG_ERROR_MESSAGE("Render target mask (", RenderTargetMask, ") contains buffer ", PlatformMisc::GetLSB(RenderTargetMask), " but this device only supports ", m_Caps.MaxDrawBuffers, " draw buffers");
        RenderTargetMask &= (1u << m_Caps.MaxDrawBuffers) - 1u;
    }

    for (Uint32 Mask = RenderTargetMask; Mask != 0;)
    {
        Uint32 rt = PlatformMisc::GetLSB(Mask);
        Mask &= ~(1u << rt);
        VERIFY_EXPR(rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers);

        const RenderTargetBlendDesc& RT = BSDsc.RenderTargets[rt];
        VERIFY(RT.RenderTargetWriteMask != COLOR_MASK_NONE, "Render target write mask should not be COLOR_MASK_NONE if corresponding bit is set in RenderTargetMask");
        if (NonIndexedColorMask == COLOR_MASK_NONE)
        {
            NonIndexedColorMask = RT.RenderTargetWriteMask;
        }
        else if (NonIndexedColorMask != RT.RenderTargetWriteMask)
        {
            bUseIndexedColorWriteMasks = true;
        }

        if (BSDsc.IndependentBlendEnable && RT.BlendEnable)
            bEnableBlend = true;
    }

    if (bUseIndexedColorWriteMasks)
    {
        for (Uint32 Mask = RenderTargetMask; Mask != 0;)
        {
            Uint32 rt = PlatformMisc::GetLSB(Mask);
            Mask &= ~(1u << rt);
            VERIFY_EXPR(rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers);
            SetColorWriteMaskIndexed(rt, BSDsc.RenderTargets[rt].RenderTargetWriteMask);
        }
    }
    else if (NonIndexedColorMask != COLOR_MASK_NONE)
    {
        // If the color write mask is COLOR_MASK_NONE, the draw buffer is disabled with glDrawBuffer.
        SetColorWriteMask(NonIndexedColorMask);
    }

    if (bEnableBlend)
    {
        //  Sets the blend enable flag for ALL color buffers.
        glEnable(GL_BLEND);
        DEV_CHECK_GL_ERROR("Failed to enable alpha blending");

        if (BSDsc.AlphaToCoverageEnable)
        {
            glEnable(GL_SAMPLE_ALPHA_TO_COVERAGE);
            DEV_CHECK_GL_ERROR("Failed to enable alpha to coverage");
        }
        else
        {
            glDisable(GL_SAMPLE_ALPHA_TO_COVERAGE);
            DEV_CHECK_GL_ERROR("Failed to disable alpha to coverage");
        }

        if (BSDsc.IndependentBlendEnable)
        {
            for (int i = 0; i < static_cast<int>(MAX_RENDER_TARGETS); ++i)
            {
                const RenderTargetBlendDesc& RT = BSDsc.RenderTargets[i];

                if (i >= m_Caps.MaxDrawBuffers)
                {
                    if (RT.BlendEnable)
                        LOG_ERROR_MESSAGE("Blend is enabled for render target ", i, " but this device only supports ", m_Caps.MaxDrawBuffers, " draw buffers");
                    continue;
                }

                if (RT.BlendEnable)
                {
                    glEnablei(GL_BLEND, i);
                    DEV_CHECK_GL_ERROR("Failed to enable alpha blending");

                    GLenum srcFactorRGB   = BlendFactor2GLBlend(RT.SrcBlend);
                    GLenum dstFactorRGB   = BlendFactor2GLBlend(RT.DestBlend);
                    GLenum srcFactorAlpha = BlendFactor2GLBlend(RT.SrcBlendAlpha);
                    GLenum dstFactorAlpha = BlendFactor2GLBlend(RT.DestBlendAlpha);
                    glBlendFuncSeparatei(i, srcFactorRGB, dstFactorRGB, srcFactorAlpha, dstFactorAlpha);
                    DEV_CHECK_GL_ERROR("Failed to set separate blending factors");
                    GLenum modeRGB   = BlendOperation2GLBlendOp(RT.BlendOp);
                    GLenum modeAlpha = BlendOperation2GLBlendOp(RT.BlendOpAlpha);
                    glBlendEquationSeparatei(i, modeRGB, modeAlpha);
                    DEV_CHECK_GL_ERROR("Failed to set separate blending equations");
                }
                else
                {
                    glDisablei(GL_BLEND, i);
                    DEV_CHECK_GL_ERROR("Failed to disable alpha blending");
                }
            }
        }
        else
        {
            const RenderTargetBlendDesc& RT0 = BSDsc.RenderTargets[0];

            GLenum srcFactorRGB   = BlendFactor2GLBlend(RT0.SrcBlend);
            GLenum dstFactorRGB   = BlendFactor2GLBlend(RT0.DestBlend);
            GLenum srcFactorAlpha = BlendFactor2GLBlend(RT0.SrcBlendAlpha);
            GLenum dstFactorAlpha = BlendFactor2GLBlend(RT0.DestBlendAlpha);
            glBlendFuncSeparate(srcFactorRGB, dstFactorRGB, srcFactorAlpha, dstFactorAlpha);
            DEV_CHECK_GL_ERROR("Failed to set blending factors");

            GLenum modeRGB   = BlendOperation2GLBlendOp(RT0.BlendOp);
            GLenum modeAlpha = BlendOperation2GLBlendOp(RT0.BlendOpAlpha);
            glBlendEquationSeparate(modeRGB, modeAlpha);
            DEV_CHECK_GL_ERROR("Failed to set blending equations");
        }
    }
    else
    {
        //  Sets the blend disable flag for ALL color buffers.
        glDisable(GL_BLEND);
        DEV_CHECK_GL_ERROR("Failed to disable alpha blending");
    }
}